

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

int __thiscall deqp::gls::DrawTest::init(DrawTest *this,EVP_PKEY_CTX *ctx)

{
  ChannelType CVar1;
  Primitive PVar2;
  pointer pDVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Primitive *pPVar7;
  undefined4 extraout_var_01;
  GLContext *this_00;
  ReferenceContextBuffers *this_01;
  undefined4 extraout_var_02;
  ReferenceContext *this_02;
  AttributePack *pAVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar9;
  ulong uVar10;
  ChannelOrder width;
  ulong uVar11;
  ChannelType height;
  bool bVar12;
  float fVar13;
  ReferenceContextLimits limits;
  bool local_12c;
  PixelBufferAccess local_128;
  ReferenceContextLimits local_100;
  MultisamplePixelBufferAccess local_a8;
  MultisamplePixelBufferAccess local_80;
  MultisamplePixelBufferAccess local_58;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  width = *(ChannelOrder *)CONCAT44(extraout_var,iVar5);
  if (0x1ff < (int)width) {
    width = 0x200;
  }
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  CVar1 = *(ChannelType *)(CONCAT44(extraout_var_00,iVar5) + 4);
  height = 0x200;
  if ((int)CVar1 < 0x200) {
    height = CVar1;
  }
  pDVar3 = (this->m_specs).
           super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((long)(this->m_specs).
                      super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 4) * -0x33333333;
  if ((int)uVar9 < 1) {
    bVar12 = false;
  }
  else {
    bVar12 = true;
    if (4 < pDVar3->primitive - PRIMITIVE_LINES) {
      uVar10 = (ulong)(uVar9 & 0x7fffffff);
      pPVar7 = &pDVar3[1].primitive;
      uVar4 = 1;
      do {
        uVar11 = uVar4;
        if (uVar10 == uVar11) break;
        PVar2 = *pPVar7;
        pPVar7 = pPVar7 + 0x14;
        uVar4 = uVar11 + 1;
      } while (4 < PVar2 - PRIMITIVE_LINES);
      bVar12 = uVar11 < uVar10;
    }
  }
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = 1;
  if (bVar12) {
    iVar5 = (uint)(1 < *(int *)(CONCAT44(extraout_var_01,iVar6) + 0x20)) * 3 + 1;
  }
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_100,this->m_renderCtx);
  this_00 = (GLContext *)operator_new(0x170);
  local_128.super_ConstPixelBufferAccess.m_format.order = R;
  local_128.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_128.super_ConstPixelBufferAccess.m_size.m_data[0] = width;
  local_128.super_ConstPixelBufferAccess.m_size.m_data[1] = height;
  sglr::GLContext::GLContext
            (this_00,this->m_renderCtx,((this->super_TestCase).super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&local_128);
  this->m_glesContext = (Context *)this_00;
  uVar9 = (*this->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar9 & 0x3ff) != 2) {
    uVar9 = (*this->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar9 & 0x3ff) != 3) {
      ctxType.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
      bVar12 = glu::contextSupports(ctxType,(ApiType)0x13);
      if (!bVar12) {
        uVar9 = (*this->m_renderCtx->_vptr_RenderContext[2])();
        if ((uVar9 & 0x300) != 0x100) goto LAB_004aed41;
      }
      local_12c = true;
      goto LAB_004aed49;
    }
  }
LAB_004aed41:
  local_12c = false;
LAB_004aed49:
  this_01 = (ReferenceContextBuffers *)operator_new(0x78);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_01,(PixelFormat *)(CONCAT44(extraout_var_02,iVar6) + 8),0,0,width,height,iVar5);
  this->m_refBuffers = this_01;
  this_02 = (ReferenceContext *)operator_new(0x61b0);
  tcu::TextureLevel::getAccess(&local_128,(TextureLevel *)this_01);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_128);
  tcu::TextureLevel::getAccess(&local_128,&this->m_refBuffers->m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_128);
  tcu::TextureLevel::getAccess(&local_128,&this->m_refBuffers->m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_128);
  sglr::ReferenceContext::ReferenceContext(this_02,&local_100,&local_58,&local_80,&local_a8);
  this->m_refContext = this_02;
  pAVar8 = (AttributePack *)operator_new(0x60);
  local_128.super_ConstPixelBufferAccess.m_format.type = height;
  local_128.super_ConstPixelBufferAccess.m_format.order = width;
  AttributePack::AttributePack
            (pAVar8,(this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,
             this->m_glesContext,(UVec2 *)&local_128,local_12c,true);
  this->m_glArrayPack = pAVar8;
  pAVar8 = (AttributePack *)operator_new(0x60);
  AttributePack::AttributePack
            (pAVar8,(this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,
             &this->m_refContext->super_Context,(UVec2 *)&local_128,local_12c,false);
  this->m_rrArrayPack = pAVar8;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar13 = ceilf((6.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_03,iVar5) + 8) & 0x1f))) *
                 256.0);
  this->m_maxDiffRed = (int)fVar13;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar13 = ceilf((6.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_04,iVar5) + 0xc) & 0x1f))) *
                 256.0);
  this->m_maxDiffGreen = (int)fVar13;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar13 = ceilf((6.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_05,iVar5) + 0x10) & 0x1f))) *
                 256.0);
  this->m_maxDiffBlue = (int)fVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.extensionStr._M_dataplus._M_p != &local_100.extensionStr.field_2) {
    operator_delete(local_100.extensionStr._M_dataplus._M_p,
                    local_100.extensionStr.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.extensionList);
  return extraout_EAX;
}

Assistant:

void DrawTest::init (void)
{
	DE_ASSERT(!m_specs.empty());
	DE_ASSERT(contextSupports(m_renderCtx.getType(), m_specs[0].apiType));

	const int						renderTargetWidth	= de::min(MAX_RENDER_TARGET_SIZE, m_renderCtx.getRenderTarget().getWidth());
	const int						renderTargetHeight	= de::min(MAX_RENDER_TARGET_SIZE, m_renderCtx.getRenderTarget().getHeight());

	// lines have significantly different rasterization in MSAA mode
	const bool						isLineCase			= containsLineCases(m_specs);
	const bool						isMSAACase			= m_renderCtx.getRenderTarget().getNumSamples() > 1;
	const int						renderTargetSamples	= (isMSAACase && isLineCase) ? (4) : (1);

	sglr::ReferenceContextLimits	limits				(m_renderCtx);
	bool							useVao				= false;

	m_glesContext = new sglr::GLContext(m_renderCtx, m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));

	if (m_renderCtx.getType().getAPI() == glu::ApiType::es(2,0) || m_renderCtx.getType().getAPI() == glu::ApiType::es(3,0))
		useVao = false;
	else if (contextSupports(m_renderCtx.getType(), glu::ApiType::es(3,1)) || glu::isContextTypeGLCore(m_renderCtx.getType()))
		useVao = true;
	else
		DE_FATAL("Unknown context type");

	m_refBuffers	= new sglr::ReferenceContextBuffers(m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, renderTargetWidth, renderTargetHeight, renderTargetSamples);
	m_refContext	= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());

	m_glArrayPack	= new AttributePack(m_testCtx, m_renderCtx, *m_glesContext, tcu::UVec2(renderTargetWidth, renderTargetHeight), useVao, true);
	m_rrArrayPack	= new AttributePack(m_testCtx, m_renderCtx, *m_refContext,  tcu::UVec2(renderTargetWidth, renderTargetHeight), useVao, false);

	m_maxDiffRed	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().redBits)));
	m_maxDiffGreen	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().greenBits)));
	m_maxDiffBlue	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().blueBits)));
}